

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O1

void __thiscall
wasm::CoalesceLocals::pickIndices
          (CoalesceLocals *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  Index IVar1;
  uint uVar2;
  uint uVar3;
  iterator __position;
  pointer puVar4;
  void *pvVar5;
  pointer puVar6;
  uint *puVar7;
  undefined1 auVar8 [16];
  size_t sVar9;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  int iVar14;
  uint *puVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjustedTotalCopies;
  Index removedCopies;
  Index reverseRemovedCopies;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ret;
  undefined1 local_48 [16];
  pointer local_38;
  
  IVar1 = (this->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
          numLocals;
  if (IVar1 != 0) {
    if (IVar1 == 1) {
      local_88._0_4_ = 0;
      __position._M_current =
           (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (indices,__position,(uint *)local_88);
      }
      else {
        *__position._M_current = 0;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                 &(this->
                  super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                  ).
                  super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                  .totalCopies);
      sVar9 = Function::getNumParams
                        ((this->
                         super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                         ).
                         super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                         .
                         super_ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .currFunction);
      if (sVar9 != 0) {
        uVar10 = 0;
        do {
          *(undefined4 *)(CONCAT44(local_88._4_4_,local_88._0_4_) + uVar10 * 4) = 0xffffffff;
          uVar10 = uVar10 + 1;
        } while ((uVar10 & 0xffffffff) < sVar9);
      }
      uVar10 = (ulong)(this->
                      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                      ).
                      super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .numLocals;
      _removedCopies = (undefined1  [16])0x0;
      ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,uVar10);
      auVar8 = _DAT_00b69d00;
      if (uVar10 != 0) {
        lVar16 = uVar10 - 1;
        auVar17._8_4_ = (int)lVar16;
        auVar17._0_8_ = lVar16;
        auVar17._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar12 = 0;
        auVar17 = auVar17 ^ _DAT_00b69d00;
        auVar18 = _DAT_00b69cf0;
        do {
          auVar19 = auVar18 ^ auVar8;
          if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                      auVar17._4_4_ < auVar19._4_4_) & 1)) {
            _removedCopies[uVar12] = (uint)uVar12;
          }
          if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
              auVar19._12_4_ <= auVar17._12_4_) {
            _removedCopies[uVar12 + 1] = (uint)uVar12 + 1;
          }
          uVar12 = uVar12 + 2;
          lVar16 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar16 + 2;
        } while ((uVar10 + 1 & 0xfffffffffffffffe) != uVar12);
      }
      adjustOrderByPriorities
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      puVar6 = ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar4 = _removedCopies;
      _removedCopies = local_48;
      ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = local_38;
      local_48 = (undefined1  [16])0x0;
      local_38 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4,(long)puVar6 - (long)puVar4);
      }
      if ((pointer)local_48._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
      }
      pickIndicesFromOrder
                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,indices,
                 (Index *)&adjustedTotalCopies.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      puVar13 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar15 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      puVar11 = puVar13 + 1;
      if (puVar11 != puVar15 && puVar13 != puVar15) {
        do {
          puVar7 = puVar11;
          if (*puVar11 <= *puVar13) {
            puVar7 = puVar13;
          }
          puVar13 = puVar7;
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar15);
      }
      if ((long)ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start - (long)_removedCopies == 0) {
        __assert_fail("num > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/permutations.h"
                      ,0x25,"void wasm::setIdentity(std::vector<Index> &)");
      }
      uVar2 = *puVar13;
      uVar10 = 0;
      do {
        _removedCopies[uVar10] = (uint)uVar10;
        uVar10 = uVar10 + 1;
      } while ((uVar10 & 0xffffffff) <
               (ulong)((long)ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start - (long)_removedCopies >> 2));
      uVar3 = (this->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
              .numLocals;
      uVar10 = (ulong)uVar3;
      if ((uint)sVar9 < uVar3) {
        uVar12 = sVar9 & 0xffffffff;
        iVar14 = -1;
        do {
          _removedCopies[uVar12] = (int)uVar10 + iVar14;
          uVar12 = uVar12 + 1;
          uVar10 = (ulong)(this->
                          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                          ).
                          super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                          .numLocals;
          iVar14 = iVar14 + -1;
        } while (uVar12 < uVar10);
      }
      adjustOrderByPriorities
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      puVar6 = ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar4 = _removedCopies;
      _removedCopies = local_48;
      ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = local_38;
      local_48 = (undefined1  [16])0x0;
      local_38 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4,(long)puVar6 - (long)puVar4);
      }
      if ((pointer)local_48._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
      }
      local_48 = (undefined1  [16])0x0;
      local_38 = (pointer)0x0;
      pickIndicesFromOrder
                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                 (Index *)((long)&adjustedTotalCopies.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      puVar11 = (uint *)(local_48._0_8_ + 4);
      puVar13 = (uint *)local_48._0_8_;
      puVar15 = (uint *)local_48._0_8_;
      if (puVar11 != (uint *)local_48._8_8_ && local_48._0_8_ != local_48._8_8_) {
        do {
          puVar13 = puVar11;
          if (*puVar11 <= *puVar15) {
            puVar13 = puVar15;
          }
          puVar11 = puVar11 + 1;
          puVar15 = puVar13;
        } while (puVar11 != (uint *)local_48._8_8_);
      }
      if (((uint)adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage <
           adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) ||
         ((auVar8 = local_48,
          adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
          (uint)adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage && (*puVar13 < uVar2)))) {
        puVar4 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_38;
        auVar8._0_8_ = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start;
        auVar8._8_8_ = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
        local_38 = puVar4;
      }
      local_48 = auVar8;
      if ((pointer)local_48._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
      }
      if (_removedCopies != (pointer)0x0) {
        operator_delete(_removedCopies,
                        (long)ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)_removedCopies);
      }
      pvVar5 = (void *)CONCAT44(local_88._4_4_,local_88._0_4_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)adjustedTotalCopies.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5);
      }
    }
  }
  return;
}

Assistant:

void CoalesceLocals::pickIndices(std::vector<Index>& indices) {
  if (numLocals == 0) {
    return;
  }
  if (numLocals == 1) {
    indices.push_back(0);
    return;
  }
  // take into account total copies. but we must keep params in place, so give
  // them max priority
  auto adjustedTotalCopies = totalCopies;
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    adjustedTotalCopies[i] = std::numeric_limits<Index>::max();
  }
  // first try the natural order. this is less arbitrary than it seems, as the
  // program may have a natural order of locals inherent in it.
  auto order = makeIdentity(numLocals);
  order = adjustOrderByPriorities(order, adjustedTotalCopies);
  Index removedCopies;
  pickIndicesFromOrder(order, indices, removedCopies);
  auto maxIndex = *std::max_element(indices.begin(), indices.end());
  // next try the reverse order. this both gives us another chance at something
  // good, and also the very naturalness of the simple order may be quite
  // suboptimal
  setIdentity(order);
  for (Index i = numParams; i < numLocals; i++) {
    order[i] = numParams + numLocals - 1 - i;
  }
  order = adjustOrderByPriorities(order, adjustedTotalCopies);
  std::vector<Index> reverseIndices;
  Index reverseRemovedCopies;
  pickIndicesFromOrder(order, reverseIndices, reverseRemovedCopies);
  auto reverseMaxIndex =
    *std::max_element(reverseIndices.begin(), reverseIndices.end());
  // prefer to remove copies foremost, as it matters more for code size (minus
  // gzip), and improves throughput.
  if (reverseRemovedCopies > removedCopies ||
      (reverseRemovedCopies == removedCopies && reverseMaxIndex < maxIndex)) {
    indices.swap(reverseIndices);
  }
}